

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

void clean_strings(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    if (strings1[local_c] != (xmlChar *)0x0) {
      (*_xmlFree)(strings1[local_c]);
    }
  }
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    if (strings2[local_c] != (xmlChar *)0x0) {
      (*_xmlFree)(strings2[local_c]);
    }
  }
  return;
}

Assistant:

static void clean_strings(void) {
    int i;

    for (i = 0; i < NB_STRINGS_MAX; i++) {
        if (strings1[i] != NULL) /* really should not happen */
	    xmlFree(strings1[i]);
    }
    for (i = 0; i < NB_STRINGS_MAX; i++) {
        if (strings2[i] != NULL) /* really should not happen */
	    xmlFree(strings2[i]);
    }
}